

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::WeightParams::MergePartialFromCodedStream
          (WeightParams *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  bool bVar4;
  short extraout_AX;
  short extraout_AX_00;
  short extraout_AX_01;
  short extraout_AX_02;
  short sVar5;
  uint uVar6;
  int iVar7;
  uint32 uVar8;
  QuantizationParams *this_00;
  ulong extraout_RAX;
  uint uVar9;
  ulong uVar10;
  int local_54;
  
  do {
    pbVar3 = input->buffer_;
    uVar8 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      pbVar1 = pbVar3 + 1;
      uVar9 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar8 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) || (uVar8 = (uint)bVar2, (~(uint)*pbVar1 & uVar9) < 0x80)
           ) goto LAB_0022d027;
        uVar9 = ((uint)bVar2 + (uint)*pbVar1 * 0x80) - 0x80;
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar10 = (ulong)uVar9 | 0x100000000;
    }
    else {
LAB_0022d027:
      uVar8 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar8);
      uVar10 = 0;
      if (uVar8 - 1 < 0x3fff) {
        uVar10 = 0x100000000;
      }
      uVar10 = uVar8 | uVar10;
    }
    uVar9 = (uint)uVar10;
    if ((uVar10 & 0x100000000) == 0) goto LAB_0022cf6d;
    uVar6 = (uint)(uVar10 >> 3) & 0x1fffffff;
    if (uVar6 < 0x1f) {
      if (uVar6 == 1) {
        if ((char)uVar10 == '\r') {
          bVar4 = google::protobuf::internal::WireFormatLite::
                  ReadRepeatedPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                            (1,10,input,&this->floatvalue_);
        }
        else {
          if ((uVar9 & 0xff) != 10) goto LAB_0022cf6d;
          bVar4 = google::protobuf::internal::WireFormatLite::
                  ReadPackedPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                            (input,&this->floatvalue_);
        }
LAB_0022cf93:
        if (bVar4 == false) {
LAB_0022d01d:
          iVar7 = 6;
          goto LAB_0022cf9d;
        }
      }
      else {
        if (uVar6 == 2) {
          MergePartialFromCodedStream();
          sVar5 = extraout_AX_01;
        }
        else {
          if (uVar6 != 0x1e) goto LAB_0022cf6d;
          MergePartialFromCodedStream();
          sVar5 = extraout_AX;
        }
LAB_0022d005:
        if (sVar5 == 0) goto LAB_0022cf6d;
        iVar7 = 6;
        if (sVar5 != 1) goto LAB_0022cf9d;
      }
LAB_0022cf9b:
      iVar7 = 0;
    }
    else if (uVar6 == 0x28) {
      if ((char)uVar10 != 'B') goto LAB_0022cf6d;
      if (this->quantization_ == (QuantizationParams *)0x0) {
        this_00 = (QuantizationParams *)operator_new(0x28);
        QuantizationParams::QuantizationParams(this_00);
        this->quantization_ = this_00;
      }
      MergePartialFromCodedStream();
      iVar7 = local_54;
      if ((extraout_RAX & 1) == 0) goto LAB_0022cf9b;
    }
    else {
      if (uVar6 == 0x1f) {
        MergePartialFromCodedStream();
        sVar5 = extraout_AX_02;
        goto LAB_0022d005;
      }
      if (uVar6 == 0x32) {
        MergePartialFromCodedStream();
        if (extraout_AX_00 != 1) {
          if (extraout_AX_00 != 0) goto LAB_0022cf9b;
          goto LAB_0022cf6d;
        }
        goto LAB_0022d01d;
      }
LAB_0022cf6d:
      iVar7 = 7;
      if ((uVar9 & 7) != 4 && uVar9 != 0) {
        bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar9);
        goto LAB_0022cf93;
      }
    }
LAB_0022cf9d:
    if (iVar7 != 0) {
      return iVar7 != 6;
    }
  } while( true );
}

Assistant:

bool WeightParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.WeightParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated float floatValue = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, this->mutable_floatvalue())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(13u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 1, 10u, input, this->mutable_floatvalue())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bytes float16Value = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadBytes(
                input, this->mutable_float16value()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bytes rawValue = 30;
      case 30: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(242u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadBytes(
                input, this->mutable_rawvalue()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bytes int8RawValue = 31;
      case 31: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(250u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadBytes(
                input, this->mutable_int8rawvalue()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.QuantizationParams quantization = 40;
      case 40: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(322u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_quantization()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool isUpdatable = 50;
      case 50: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(400u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &isupdatable_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.WeightParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.WeightParams)
  return false;
#undef DO_
}